

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

void __thiscall MPL::detail::ModelPackageImpl::removeItem(ModelPackageImpl *this,string *identifier)

{
  int iVar1;
  runtime_error *prVar2;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  path path;
  undefined1 local_c0 [8];
  string local_b8;
  path local_98;
  string local_70;
  path local_50;
  
  getItemInfoEntry((ModelPackageImpl *)local_c0,(string *)this);
  if (local_c0 == (undefined1  [8])0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_c0 + 0x28),"Failed to look up file with identifier: ",identifier);
    std::runtime_error::runtime_error(prVar2,(string *)(local_c0 + 0x28));
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70._M_dataplus._M_p = local_c0 + 0x60;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x50),"path","");
  JsonMap::getString((string *)(local_c0 + 8),(JsonMap *)local_c0,(string *)(local_c0 + 0x50));
  std::filesystem::__cxx11::path::path
            ((path *)(local_c0 + 0x70),(string_type *)(local_c0 + 8),auto_format);
  std::filesystem::__cxx11::operator/
            ((path *)(local_c0 + 0x28),&this->m_packageDataDirPath,(path *)(local_c0 + 0x70));
  std::filesystem::__cxx11::path::~path((path *)(local_c0 + 0x70));
  if (local_b8._M_dataplus._M_p != local_c0 + 0x18) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._0_8_ + 1);
  }
  if (local_70._M_dataplus._M_p != local_c0 + 0x60) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar1 = remove(local_98._M_pathname._M_dataplus._M_p);
  if (iVar1 == 0) {
    removeItemInfoEntry(this,identifier);
    std::filesystem::__cxx11::path::~path((path *)(local_c0 + 0x28));
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_c0);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_b8._M_dataplus._M_p = local_c0 + 0x18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_c0 + 8),local_98._M_pathname._M_dataplus._M_p,
             local_98._M_pathname._M_dataplus._M_p + local_98._M_pathname._M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c0 + 0x70),"Failed to remove file at path: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c0 + 8)
                );
  std::runtime_error::runtime_error(prVar2,(string *)(local_c0 + 0x70));
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::removeItem(const std::string& identifier)
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        throw std::runtime_error("Failed to look up file with identifier: " + identifier);
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    if (0 != std::remove(path.c_str())) {
        throw std::runtime_error("Failed to remove file at path: " + path.string());
    }
    
    removeItemInfoEntry(identifier);
}